

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QRect __thiscall QRenderRule::boxRect(QRenderRule *this,QRect *cr,int flags)

{
  QStyleSheetBoxData *pQVar1;
  QStyleSheetBorderData *pQVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  QRect QVar6;
  
  uVar3._0_4_ = cr->x1;
  uVar3._4_4_ = cr->y1;
  uVar4._0_4_ = cr->x2;
  uVar4._4_4_ = cr->y2;
  uVar5 = uVar3 >> 0x20;
  pQVar1 = (this->b).d.ptr;
  if (pQVar1 != (QStyleSheetBoxData *)0x0) {
    if ((flags & 1U) != 0) {
      uVar5 = (ulong)(uint)(uVar3._4_4_ - pQVar1->margins[0]);
      uVar3 = (ulong)(uint)((undefined4)uVar3 - pQVar1->margins[3]);
      uVar4 = CONCAT44(uVar4._4_4_ + pQVar1->margins[2],pQVar1->margins[1] + (undefined4)uVar4);
    }
    if ((flags & 4U) != 0) {
      uVar3 = (ulong)(uint)((int)uVar3 - pQVar1->paddings[3]);
      uVar5 = (ulong)(uint)((int)uVar5 - pQVar1->paddings[0]);
      uVar4 = CONCAT44((int)((ulong)uVar4 >> 0x20) + pQVar1->paddings[2],
                       pQVar1->paddings[1] + (int)uVar4);
    }
  }
  pQVar2 = (this->bd).d.ptr;
  if ((flags & 2U) != 0 && pQVar2 != (QStyleSheetBorderData *)0x0) {
    uVar3 = (ulong)(uint)((int)uVar3 - pQVar2->borders[3]);
    uVar5 = (ulong)(uint)((int)uVar5 - pQVar2->borders[0]);
    uVar4 = CONCAT44((int)((ulong)uVar4 >> 0x20) + pQVar2->borders[2],
                     pQVar2->borders[1] + (int)uVar4);
  }
  QVar6._0_8_ = uVar3 & 0xffffffff | uVar5 << 0x20;
  QVar6.x2.m_i = (int)uVar4;
  QVar6.y2.m_i = (int)((ulong)uVar4 >> 0x20);
  return QVar6;
}

Assistant:

QRect QRenderRule::boxRect(const QRect& cr, int flags) const
{
    QRect r = cr;
    if (hasBox()) {
        if (flags & Margin) {
            const int *m = box()->margins;
            r.adjust(-m[LeftEdge], -m[TopEdge], m[RightEdge], m[BottomEdge]);
        }
        if (flags & Padding) {
            const int *p = box()->paddings;
            r.adjust(-p[LeftEdge], -p[TopEdge], p[RightEdge], p[BottomEdge]);
        }
    }
    if (hasBorder() && (flags & Border)) {
        const int *b = border()->borders;
        r.adjust(-b[LeftEdge], -b[TopEdge], b[RightEdge], b[BottomEdge]);
    }
    return r;
}